

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

double ** covarianceMatrix(double **x,double *x_mu,double **y,double *y_mu,int start,int end,int n)

{
  int m_00;
  double **x_00;
  double **y_00;
  double **x_01;
  double **ppdVar1;
  int m;
  double **tmpyT;
  double **tmpy;
  double **tmpx;
  double **tmp;
  int l;
  int k;
  int end_local;
  int start_local;
  double *y_mu_local;
  double **y_local;
  double *x_mu_local;
  double **x_local;
  
  m_00 = (end - start) + 1;
  x_00 = matrix(1,(long)m_00,1,3);
  y_00 = matrix(1,(long)m_00,1,3);
  for (tmp._4_4_ = 1; tmp._4_4_ <= m_00; tmp._4_4_ = tmp._4_4_ + 1) {
    for (tmp._0_4_ = 1; (int)tmp <= n; tmp._0_4_ = (int)tmp + 1) {
      x_00[tmp._4_4_][(int)tmp] = y[tmp._4_4_ + start + -1][(int)tmp] - y_mu[(int)tmp];
      y_00[tmp._4_4_][(int)tmp] = x[tmp._4_4_ + start + -1][(int)tmp] - x_mu[(int)tmp];
    }
  }
  x_01 = transpose_matrix(x_00,m_00,n);
  ppdVar1 = multiply_matrix(x_01,n,m_00,y_00,m_00,n);
  for (tmp._4_4_ = 1; tmp._4_4_ <= n; tmp._4_4_ = tmp._4_4_ + 1) {
    for (tmp._0_4_ = 1; (int)tmp <= n; tmp._0_4_ = (int)tmp + 1) {
      ppdVar1[tmp._4_4_][(int)tmp] = ppdVar1[tmp._4_4_][(int)tmp] / (double)(end - start);
    }
  }
  free_matrix(y_00,1,(long)m_00,1,3);
  free_matrix(x_00,1,(long)m_00,1,3);
  free_matrix(x_01,1,(long)n,1,(long)m_00);
  return ppdVar1;
}

Assistant:

double **covarianceMatrix(double **x, double *x_mu, double **y, double *y_mu, int start, int end, int n) {
    int k, l;
    double **tmp;
    double **tmpx;
    double **tmpy;
    double **tmpyT;

    int m = end - start + 1;

    tmpy = matrix(1, m, 1, NP);
    tmpx = matrix(1, m, 1, NP);
    /* precompute the mean matrix of x and y for speed */
    for (k = 1; k <= m; k++) {
        for (l = 1; l <= n; l++) {
            tmpy[k][l] = y[k + start - 1][l] - y_mu[l];  //printf("TMP Y\n");  print_matrix(tmpy,3,3);
            tmpx[k][l] = x[k + start - 1][l] - x_mu[l];  //printf("TMP X\n");  print_matrix(tmpx,3,3);
        }
    }
    tmpyT = transpose_matrix(tmpy, m, n);
    tmp = multiply_matrix(tmpyT, n, m, tmpx, m, n);
    for (k = 1; k <= n; k++) {
        for (l = 1; l <= n; l++)
            tmp[k][l] /= m - 1;  // Why m-1????
    }

    /* cleanup */
    free_matrix(tmpx, 1, m, 1, NP);
    free_matrix(tmpy, 1, m, 1, NP);
    free_matrix(tmpyT, 1, n, 1, m);
    //    if (DEBUG)  printf("\t\tcovariance_matrix()::Covariance Matrix\n"); print_matrix(tmp,3,3);

    return tmp;
}